

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int RunPLC(undefined8 param_1,undefined2 param_2,undefined8 param_3,string *param_4)

{
  int iVar1;
  ostream *poVar2;
  string local_368 [32];
  stringstream local_348 [8];
  stringstream stream;
  ostream local_338 [383];
  allocator local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  undefined2 uStack_8a;
  SymbolAccess local_80 [8];
  SymbolAccess device;
  Commandline *args_local;
  string *gw_local;
  uint16_t port_local;
  AmsNetId netid_local;
  
  bhf::ads::SymbolAccess::SymbolAccess(local_80,param_3,CONCAT26(uStack_8a,(int6)param_1),param_2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"plc command is missing",&local_d1);
  bhf::Commandline::Pop<std::__cxx11::string>((Commandline *)local_b0,param_4);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  iVar1 = std::__cxx11::string::compare(local_b0);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"Variable name is missing",&local_129);
    bhf::Commandline::Pop<std::__cxx11::string>((Commandline *)local_108,param_4);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    _port_local = bhf::ads::SymbolAccess::Read((string *)local_80,(ostream *)local_108);
    std::__cxx11::string::~string((string *)local_108);
  }
  else {
    iVar1 = std::__cxx11::string::compare(local_b0);
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Variable name is missing",&local_171);
      bhf::Commandline::Pop<std::__cxx11::string>((Commandline *)local_150,param_4);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Value is missing",&local_1b9);
      bhf::Commandline::Pop<std::__cxx11::string>((Commandline *)local_198,param_4);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      _port_local = bhf::ads::SymbolAccess::Write((string *)local_80,(string *)local_150);
      std::__cxx11::string::~string((string *)local_198);
      std::__cxx11::string::~string((string *)local_150);
    }
    else {
      iVar1 = std::__cxx11::string::compare(local_b0);
      if (iVar1 == 0) {
        _port_local = bhf::ads::SymbolAccess::ShowSymbols((ostream *)local_80);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_348);
        poVar2 = std::operator<<(local_338,"RunPLC");
        poVar2 = std::operator<<(poVar2,"(): Unknown PLC command \'");
        poVar2 = std::operator<<(poVar2,(string *)local_b0);
        std::operator<<(poVar2,"\'\n");
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_368);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::stringstream::~stringstream(local_348);
        _port_local = -1;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  bhf::ads::SymbolAccess::~SymbolAccess(local_80);
  return _port_local;
}

Assistant:

int RunPLC(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    auto device = bhf::ads::SymbolAccess{ gw, netid, port };
    const auto command = args.Pop<std::string>("plc command is missing");

    if (!command.compare("read-symbol")) {
        const auto name = args.Pop<std::string>("Variable name is missing");
        return device.Read(name, std::cout);
    } else if (!command.compare("write-symbol")) {
        const auto name = args.Pop<std::string>("Variable name is missing");
        const auto value = args.Pop<std::string>("Value is missing");
        return device.Write(name, value);
    } else if (!command.compare("show-symbols")) {
        return device.ShowSymbols(std::cout);
    }
    LOG_ERROR(__FUNCTION__ << "(): Unknown PLC command '" << command << "'\n");
    return -1;
}